

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O3

void shm::gen_key(shm_key_t *key,int proj_id)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  undefined4 in_register_00000034;
  shm_key_t val_key;
  char local_28 [24];
  
  if (gen_key(char&[],int)::rd == '\0') {
    iVar2 = __cxa_guard_acquire(&gen_key(char&[],int)::rd,CONCAT44(in_register_00000034,proj_id));
    if (iVar2 != 0) {
      std::random_device::random_device(&gen_key::rd);
      __cxa_atexit(std::random_device::~random_device,&gen_key::rd,&__dso_handle);
      __cxa_guard_release(&gen_key(char&[],int)::rd);
    }
  }
  if (gen_key(char&[],int)::gen == '\0') {
    iVar2 = __cxa_guard_acquire(&gen_key(char&[],int)::gen);
    if (iVar2 != 0) {
      uVar1 = std::random_device::_M_getval();
      uVar3 = (ulong)uVar1;
      lVar4 = 1;
      gen_key::gen._M_x[0] = uVar3;
      do {
        uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
        gen_key::gen._M_x[lVar4] = uVar3;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x270);
      gen_key::gen._M_p = 0x270;
      __cxa_guard_release(&gen_key(char&[],int)::gen);
    }
  }
  if (gen_key(char&[],int)::distrib == '\0') {
    gen_key();
  }
  uVar1 = std::uniform_int_distribution<int>::operator()
                    (&gen_key::distrib,&gen_key::gen,&gen_key::distrib._M_param);
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[0x14] = '\0';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = '\0';
  snprintf(local_28,0x18,"%d",(ulong)uVar1);
  strncpy(*key,local_28,0x18);
  return;
}

Assistant:

void 
shm::gen_key( shm_key_t &key, const int proj_id )
{
#if _USE_POSIX_SHM_ == 1
    //string key
    UNUSED( proj_id );
    static std::random_device rd;
    static std::mt19937 gen( rd() );
    static std::uniform_int_distribution<> distrib( 0, std::numeric_limits< int >::max() );
    const auto val = distrib( gen );
    shm_key_t val_key;
    std::memset(    val_key, 
                    '\0', 
                    shm_key_length );

    std::snprintf( val_key, 
                   shm_key_length,
                   "%d",
                   val );

    shm::key_copy( key, val_key );
    return;
#elif _USE_SYSTEMV_SHM_ == 1
    //integer key
    char *path = getcwd( nullptr, 0 );
    if( path == nullptr )
    {
        std::perror( "failed to get cwd, switching to guns, a.k.a. root dir (/)" );
        key = ftok( "/", proj_id);
    }
    else
    {
        key = ftok( path, proj_id);
    }
    return;
#endif
}